

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateInlineAccessorDefinitions(SingularStringView *this,Printer *p)

{
  undefined1 *puVar1;
  long *plVar2;
  long lVar3;
  long alStack_3c8 [4];
  undefined1 auStack_3a8 [8];
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  undefined8 uStack_388;
  long *local_380 [2];
  long local_370 [2];
  undefined1 *local_360;
  undefined1 local_358 [24];
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  undefined8 uStack_328;
  Printer *local_320;
  Printer *local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  long *local_258;
  undefined8 local_250;
  long local_248;
  undefined8 uStack_240;
  long *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  long *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  puVar1 = local_358 + 8;
  alStack_3c8[3] = 0xe519ac;
  local_360 = puVar1;
  local_320 = p;
  local_318 = p;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"if_IsDefault","");
  local_310 = local_300;
  if (local_360 == puVar1) {
    uStack_2f8 = local_358._16_8_;
  }
  else {
    local_310 = local_360;
  }
  local_308 = local_358._0_8_;
  local_358._0_8_ = 0;
  local_358[8] = 0;
  alStack_3c8[3] = 0xe51a0d;
  local_360 = puVar1;
  local_2f0 = (undefined8 *)operator_new(0x18);
  *local_2f0 = this;
  local_2f0[1] = &local_320;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  alStack_3c8[3] = 0xe51a7f;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x120d342);
  local_260 = 0;
  alStack_3c8[3] = 0xe51aac;
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"update_hasbit","");
  local_258 = &local_248;
  if (local_380[0] == local_370) {
    uStack_240 = local_370[1];
  }
  else {
    local_258 = local_380[0];
  }
  local_250 = local_380[1];
  local_380[1] = (long *)0x0;
  local_370[0]._0_1_ = 0;
  alStack_3c8[3] = 0xe51b0f;
  local_380[0] = local_370;
  local_238 = (long *)operator_new(0x18);
  *local_238 = (long)&local_320;
  local_238[1] = (long)this;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  alStack_3c8[3] = 0xe51b7f;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x120d342);
  local_1a8 = 0;
  alStack_3c8[3] = 0xe51bac;
  local_3a0 = &local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"set_args","");
  local_1a0 = local_190;
  if (local_3a0 == &local_390) {
    uStack_188 = uStack_388;
  }
  else {
    local_1a0 = local_3a0;
  }
  local_198 = local_398;
  local_398 = 0;
  local_390 = 0;
  alStack_3c8[3] = 0xe51c0f;
  local_3a0 = &local_390;
  local_180 = (long *)operator_new(0x18);
  *local_180 = (long)&local_320;
  local_180[1] = (long)this;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  alStack_3c8[3] = 0xe51c7f;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x120d342);
  local_f0 = 0;
  alStack_3c8[3] = 0xe51cac;
  local_340 = &local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"check_hasbit","");
  local_e8 = local_d8;
  if (local_340 == &local_330) {
    uStack_d0 = uStack_328;
  }
  else {
    local_e8 = local_340;
  }
  local_e0 = local_338;
  local_338 = 0;
  local_330 = 0;
  alStack_3c8[3] = 0xe51d0f;
  local_340 = &local_330;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = this;
  local_c8[1] = &local_320;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  alStack_3c8[3] = 0xe51d7e;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x120d342);
  local_38 = 0;
  alStack_3c8[3] = 0xe51dab;
  io::Printer::Emit(local_318,&local_310,4,0x45e,
                    "\n        inline ::absl::string_view $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_>\n        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          $field_$.Set(value, $set_args$);\n        }\n      "
                   );
  lVar3 = 0x2e0;
  do {
    if (*(char *)((long)&local_318 + lVar3) == '\x01') {
      alStack_3c8[3] = 0xe51dd5;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_358 + lVar3));
    }
    if ((long *)((long)local_370 + lVar3) != *(long **)((long)local_380 + lVar3)) {
      alStack_3c8[3] = 0xe51df1;
      operator_delete(*(long **)((long)local_380 + lVar3),*(long *)((long)local_370 + lVar3) + 1);
    }
    alStack_3c8[3] = 0xe51e00;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&uStack_388 + lVar3)]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_3a8 + 7),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_3a8 + lVar3));
    plVar2 = (long *)((long)alStack_3c8 + lVar3 + 0x10);
    *(undefined1 *)((long)&uStack_388 + lVar3) = 0xff;
    if (plVar2 != *(long **)((long)alStack_3c8 + lVar3)) {
      alStack_3c8[3] = 0xe51e20;
      operator_delete(*(long **)((long)alStack_3c8 + lVar3),*plVar2 + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if (local_340 != &local_330) {
    alStack_3c8[3] = 0xe51e40;
    operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
  }
  if (local_3a0 != &local_390) {
    alStack_3c8[3] = 0xe51e66;
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  if (local_380[0] != local_370) {
    alStack_3c8[3] = 0xe51e7d;
    operator_delete(local_380[0],CONCAT71(local_370[0]._1_7_,(undefined1)local_370[0]) + 1);
  }
  if (local_360 != local_358 + 8) {
    alStack_3c8[3] = 0xe51e94;
    operator_delete(local_360,CONCAT71(local_358._9_7_,local_358[8]) + 1);
  }
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    alStack_3c8[3] = 0xe51eb8;
    io::Printer::Emit(local_320,0,0,0x7b,
                      "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
                     );
  }
  return;
}

Assistant:

void SingularStringView::GenerateInlineAccessorDefinitions(
    io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof() || use_micro_string()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
      },
      R"cc(
        inline ::absl::string_view $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_>
        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          $field_$.Set(value, $set_args$);
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}